

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O2

Node * __thiscall Fl_Preferences::Node::find(Node *this,char *path)

{
  int iVar1;
  size_t sVar2;
  Node *pNVar3;
  char *pcVar4;
  Node *pNVar5;
  char *size;
  char *__s;
  
  while( true ) {
    pcVar4 = this->path_;
    sVar2 = strlen(pcVar4);
    sVar2 = (size_t)(int)sVar2;
    iVar1 = strncmp(path,pcVar4,sVar2);
    if (iVar1 != 0) {
      return (Node *)0x0;
    }
    pNVar5 = this;
    if (path[sVar2] != '/') break;
    while (pNVar5 = pNVar5->child_, pNVar5 != (Node *)0x0) {
      pNVar3 = find(pNVar5,path);
      pNVar5 = (Node *)&pNVar5->next_;
      if (pNVar3 != (Node *)0x0) {
        return pNVar3;
      }
    }
    __s = path + sVar2 + 1;
    pcVar4 = strchr(__s,0x2f);
    size = pcVar4 + (1 - (long)__s);
    if (pcVar4 == (char *)0x0) {
      size = (char *)0x80;
    }
    fl_strlcpy(nameBuffer,__s,(size_t)size);
    pNVar5 = (Node *)operator_new(0x48);
    Node(pNVar5,nameBuffer);
    setParent(pNVar5,this);
    this = pNVar5;
  }
  if (path[sVar2] != '\0') {
    return (Node *)0x0;
  }
  return this;
}

Assistant:

Fl_Preferences::Node *Fl_Preferences::Node::find( const char *path ) {
  int len = (int) strlen( path_ );
  if ( strncmp( path, path_, len ) == 0 ) {
    if ( path[ len ] == 0 )
      return this;
    if ( path[ len ] == '/' ) {
      Node *nd;
      for ( nd = child_; nd; nd = nd->next_ ) {
	Node *nn = nd->find( path );
	if ( nn ) return nn;
      }
      const char *s = path+len+1;
      const char *e = strchr( s, '/' );
      if (e) strlcpy( nameBuffer, s, e-s+1 );
      else strlcpy( nameBuffer, s, sizeof(nameBuffer));
      nd = new Node( nameBuffer );
      nd->setParent( this );
      return nd->find( path );
    }
  }
  return 0;
}